

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall
TTD::ScriptContextTTD::GetLoadedSources
          (ScriptContextTTD *this,
          BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *onlyLiveTopLevelBodies,
          List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *topLevelScriptLoad,
          List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *topLevelNewFunction,
          List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *topLevelEval)

{
  Type *pTVar1;
  Type pTVar2;
  undefined8 *puVar3;
  TTD_PTR_ID TVar4;
  KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation> *pKVar5;
  undefined4 uVar6;
  undefined8 this_00;
  bool bVar7;
  EntryType *pEVar8;
  undefined1 local_68 [8];
  EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  iter;
  FunctionBody *local_38;
  
  iter.
  super_IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = topLevelEval;
  if ((((topLevelScriptLoad->
        super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
        ).count != 0) ||
      ((topLevelNewFunction->
       super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
       ).count != 0)) ||
     ((topLevelEval->
      super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
      ).count != 0)) {
    TTDAbort_unrecoverable_error("Should be empty when you call this.");
  }
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_68,&this->m_ttdTopLevelScriptLoad);
  while( true ) {
    bVar7 = JsUtil::
            BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_68);
    if (!bVar7) break;
    pEVar8 = JsUtil::
             BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::Current((IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                        *)local_68);
    if (onlyLiveTopLevelBodies ==
        (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *)0x0) {
LAB_008f4a03:
      pEVar8 = JsUtil::
               BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_68);
      JsUtil::
      List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(topLevelScriptLoad,0);
      pKVar5 = &(pEVar8->
                super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>;
      uVar6 = *(undefined4 *)
               &(pKVar5->
                super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                ).
                super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                .value.field_0x4;
      TVar4 = (pEVar8->
              super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
              super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
              .super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
              .value.ContextSpecificBodyPtrId;
      pTVar2 = (topLevelScriptLoad->
               super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
               ).buffer +
               (topLevelScriptLoad->
               super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
               ).count;
      pTVar2->TopLevelBodyCtr =
           (pKVar5->
           super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
           ).super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
           value.TopLevelBodyCtr;
      *(undefined4 *)&pTVar2->field_0x4 = uVar6;
      pTVar2->ContextSpecificBodyPtrId = TVar4;
      pTVar1 = &(topLevelScriptLoad->
                super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                ).count;
      *pTVar1 = *pTVar1 + 1;
    }
    else {
      local_38 = (FunctionBody *)
                 (pEVar8->
                 super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
                 super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                 .
                 super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                 .value.ContextSpecificBodyPtrId;
      bVar7 = JsUtil::
              BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(&onlyLiveTopLevelBodies->
                             super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            ,&local_38);
      if (bVar7) goto LAB_008f4a03;
    }
    JsUtil::
    BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_68);
  }
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_68,&this->m_ttdTopLevelNewFunction);
  bVar7 = JsUtil::
          BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                     *)local_68);
  if (bVar7) {
    do {
      pEVar8 = JsUtil::
               BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_68);
      if (onlyLiveTopLevelBodies ==
          (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *)0x0) {
LAB_008f4a81:
        pEVar8 = JsUtil::
                 BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                 ::Current((IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_68);
        JsUtil::
        List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(topLevelNewFunction,0);
        pKVar5 = &(pEVar8->
                  super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>;
        uVar6 = *(undefined4 *)
                 &(pKVar5->
                  super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                  ).
                  super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                  .value.field_0x4;
        TVar4 = (pEVar8->
                super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
                super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                .
                super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                .value.ContextSpecificBodyPtrId;
        pTVar2 = (topLevelNewFunction->
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 ).buffer +
                 (topLevelNewFunction->
                 super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                 ).count;
        pTVar2->TopLevelBodyCtr =
             (pKVar5->
             super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
             ).super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
             .value.TopLevelBodyCtr;
        *(undefined4 *)&pTVar2->field_0x4 = uVar6;
        pTVar2->ContextSpecificBodyPtrId = TVar4;
        pTVar1 = &(topLevelNewFunction->
                  super_ReadOnlyList<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DefaultComparer>
                  ).count;
        *pTVar1 = *pTVar1 + 1;
      }
      else {
        local_38 = (FunctionBody *)
                   (pEVar8->
                   super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
                   super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                   .
                   super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                   .value.ContextSpecificBodyPtrId;
        bVar7 = JsUtil::
                BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(&onlyLiveTopLevelBodies->
                               super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              ,&local_38);
        if (bVar7) goto LAB_008f4a81;
      }
      JsUtil::
      BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  *)local_68);
      bVar7 = JsUtil::
              BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)local_68);
    } while (bVar7);
  }
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_68,&this->m_ttdTopLevelEval);
  bVar7 = JsUtil::
          BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::
          EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                     *)local_68);
  this_00 = iter.
            super_IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
            ._24_8_;
  if (bVar7) {
    do {
      pEVar8 = JsUtil::
               BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_68);
      if (onlyLiveTopLevelBodies ==
          (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *)0x0) {
LAB_008f4b17:
        pEVar8 = JsUtil::
                 BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                 ::Current((IteratorBase<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_68);
        JsUtil::
        List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray((List<TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)this_00,0);
        TVar4 = (pEVar8->
                super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
                super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                .
                super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                .value.ContextSpecificBodyPtrId;
        puVar3 = (undefined8 *)(*(long *)(this_00 + 8) + (long)*(int *)(this_00 + 0x10) * 0x10);
        *puVar3 = *(undefined8 *)
                   &(pEVar8->
                    super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
                    super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                    .
                    super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                    .value;
        puVar3[1] = TVar4;
        *(int *)(this_00 + 0x10) = *(int *)(this_00 + 0x10) + 1;
      }
      else {
        local_38 = (FunctionBody *)
                   (pEVar8->
                   super_DefaultHashedEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   ).super_KeyValueEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>.
                   super_ValueEntry<TTD::TopLevelFunctionInContextRelation,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>_>
                   .
                   super_KeyValueEntryDataLayout2<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                   .value.ContextSpecificBodyPtrId;
        bVar7 = JsUtil::
                BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(&onlyLiveTopLevelBodies->
                               super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              ,&local_38);
        if (bVar7) goto LAB_008f4b17;
      }
      JsUtil::
      BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  *)local_68);
      bVar7 = JsUtil::
              BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)local_68);
    } while (bVar7);
  }
  return;
}

Assistant:

void ScriptContextTTD::GetLoadedSources(const JsUtil::BaseHashSet<Js::FunctionBody*, HeapAllocator>* onlyLiveTopLevelBodies, JsUtil::List<TTD::TopLevelFunctionInContextRelation, HeapAllocator>& topLevelScriptLoad, JsUtil::List<TTD::TopLevelFunctionInContextRelation, HeapAllocator>& topLevelNewFunction, JsUtil::List<TTD::TopLevelFunctionInContextRelation, HeapAllocator>& topLevelEval)
    {
        TTDAssert(topLevelScriptLoad.Count() == 0 && topLevelNewFunction.Count() == 0 && topLevelEval.Count() == 0, "Should be empty when you call this.");

        for(auto iter = this->m_ttdTopLevelScriptLoad.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(iter.CurrentValue().ContextSpecificBodyPtrId);
            if(onlyLiveTopLevelBodies == nullptr || onlyLiveTopLevelBodies->Contains(body))
            {
                topLevelScriptLoad.Add(iter.CurrentValue());
            }
        }

        for(auto iter = this->m_ttdTopLevelNewFunction.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(iter.CurrentValue().ContextSpecificBodyPtrId);
            if(onlyLiveTopLevelBodies == nullptr || onlyLiveTopLevelBodies->Contains(body))
            {
                topLevelNewFunction.Add(iter.CurrentValue());
            }
        }

        for(auto iter = this->m_ttdTopLevelEval.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::FunctionBody* body = TTD_COERCE_PTR_ID_TO_FUNCTIONBODY(iter.CurrentValue().ContextSpecificBodyPtrId);
            if(onlyLiveTopLevelBodies == nullptr || onlyLiveTopLevelBodies->Contains(body))
            {
                topLevelEval.Add(iter.CurrentValue());
            }
        }
    }